

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.h
# Opt level: O2

void __thiscall BamTools::BamAlignment::BamAlignment(BamAlignment *this,BamAlignment *param_1)

{
  int32_t iVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->Length = param_1->Length;
  std::__cxx11::string::string((string *)&this->QueryBases,(string *)&param_1->QueryBases);
  std::__cxx11::string::string((string *)&this->AlignedBases,(string *)&param_1->AlignedBases);
  std::__cxx11::string::string((string *)&this->Qualities,(string *)&param_1->Qualities);
  std::__cxx11::string::string((string *)&this->TagData,(string *)&param_1->TagData);
  iVar1 = param_1->Position;
  uVar2 = param_1->Bin;
  uVar3 = param_1->MapQuality;
  uVar4 = param_1->AlignmentFlag;
  this->RefID = param_1->RefID;
  this->Position = iVar1;
  this->Bin = uVar2;
  this->MapQuality = uVar3;
  this->AlignmentFlag = uVar4;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            (&this->CigarData,&param_1->CigarData);
  this->InsertSize = param_1->InsertSize;
  iVar1 = param_1->MatePosition;
  this->MateRefID = param_1->MateRefID;
  this->MatePosition = iVar1;
  std::__cxx11::string::string((string *)&this->Filename,(string *)&param_1->Filename);
  BamAlignmentSupportData::BamAlignmentSupportData(&this->SupportData,&param_1->SupportData);
  std::__cxx11::string::string((string *)&this->ErrorString,(string *)&param_1->ErrorString);
  return;
}

Assistant:

class API_EXPORT BamAlignment
{

    // constructors & destructor
public:
    BamAlignment();

    // queries against alignment flags
public:
    bool IsDuplicate() const;          // returns true if this read is a PCR duplicate
    bool IsFailedQC() const;           // returns true if this read failed quality control
    bool IsFirstMate() const;          // returns true if alignment is first mate on read
    bool IsMapped() const;             // returns true if alignment is mapped
    bool IsMateMapped() const;         // returns true if alignment's mate is mapped
    bool IsMateReverseStrand() const;  // returns true if alignment's mate mapped to reverse strand
    bool IsPaired() const;             // returns true if alignment part of paired-end read
    bool IsSupplementary() const;      // returns true if this read is supplementary
    bool IsPrimaryAlignment() const;   // returns true if reported position is primary alignment
    bool IsProperPair()
        const;  // returns true if alignment is part of read that satisfied paired-end resolution
    bool IsReverseStrand() const;  // returns true if alignment mapped to reverse strand
    bool IsSecondMate() const;     // returns true if alignment is second mate on read

    // manipulate alignment flags
public:
    void SetIsDuplicate(bool ok);   // sets value of "PCR duplicate" flag
    void SetIsFailedQC(bool ok);    // sets value of "failed quality control" flag
    void SetIsFirstMate(bool ok);   // sets value of "alignment is first mate" flag
    void SetIsMapped(bool ok);      // sets value of "alignment is mapped" flag
    void SetIsMateMapped(bool ok);  // sets value of "alignment's mate is mapped" flag
    void SetIsMateReverseStrand(
        bool ok);               // sets value of "alignment's mate mapped to reverse strand" flag
    void SetIsPaired(bool ok);  // sets value of "alignment part of paired-end read" flag
    void SetIsPrimaryAlignment(bool ok);  // sets value of "position is primary alignment" flag
    void SetIsProperPair(
        bool
            ok);  // sets value of "alignment is part of read that satisfied paired-end resolution" flag
    void SetIsReverseStrand(bool ok);  // sets value of "alignment mapped to reverse strand" flag
    void SetIsSecondMate(bool ok);     // sets value of "alignment is second mate on read" flag

    // tag data access methods
public:
    // add a new tag
    template <typename T>
    bool AddTag(const std::string& tag, const std::string& type, const T& value);
    template <typename T>
    bool AddTag(const std::string& tag, const std::vector<T>& values);

    // edit (or append) tag
    template <typename T>
    bool EditTag(const std::string& tag, const std::string& type, const T& value);
    template <typename T>
    bool EditTag(const std::string& tag, const std::vector<T>& values);

    // retrieves tag data
    template <typename T>
    bool GetTag(const std::string& tag, T& destination) const;
    template <typename T>
    bool GetTag(const std::string& tag, std::vector<T>& destination) const;

    // retrieves all current tag names
    std::vector<std::string> GetTagNames() const;

    // retrieves the SAM/BAM type-code for requested tag name
    bool GetTagType(const std::string& tag, char& type) const;

    // retrieves the SAM/BAM type-code for the data elements in an array tag
    bool GetArrayTagType(const std::string& tag, char& type) const;

    // returns true if alignment has a record for this tag name
    bool HasTag(const std::string& tag) const;

    // removes a tag
    void RemoveTag(const std::string& tag);

    // additional methods
public:
    // populates alignment string fields
    bool BuildCharData();

    // calculates alignment end position
    int GetEndPosition(bool usePadded = false, bool closedInterval = false) const;

    // returns a description of the last error that occurred
    std::string GetErrorString() const;

    // retrieves the size, read locations and reference locations of soft-clip operations
    bool GetSoftClips(std::vector<int>& clipSizes, std::vector<int>& readPositions,
                      std::vector<int>& genomePositions, bool usePadded = false) const;

    // public data fields
public:
    std::string Name;        // read name
    int32_t Length;          // length of query sequence
    std::string QueryBases;  // 'original' sequence (contained in BAM file)
    std::string
        AlignedBases;  // 'aligned' sequence (QueryBases plus deletion, padding, clipping chars)
    std::string Qualities;           // FASTQ qualities (ASCII characters, not numeric values)
    std::string TagData;             // tag data (use provided methods to query/modify)
    int32_t RefID;                   // ID number for reference sequence
    int32_t Position;                // position (0-based) where alignment starts
    uint16_t Bin;                    // BAM (standard) index bin number for this alignment
    uint16_t MapQuality;             // mapping quality score
    uint32_t AlignmentFlag;          // alignment bit-flag (use provided methods to query/modify)
    std::vector<CigarOp> CigarData;  // CIGAR operations for this alignment
    int32_t MateRefID;     // ID number for reference sequence where alignment's mate was aligned
    int32_t MatePosition;  // position (0-based) where alignment's mate starts
    int32_t InsertSize;    // mate-pair insert size
    std::string Filename;  // name of BAM file which this alignment comes from

    //! \internal
    // internal utility methods
private:
    bool FindTag(const std::string& tag, char*& pTagData, const unsigned int& tagDataLength,
                 unsigned int& numBytesParsed) const;
    bool IsValidSize(const std::string& tag, const std::string& type) const;
    void SetErrorString(const std::string& where, const std::string& what) const;
    bool SkipToNextTag(const char storageType, char*& pTagData, unsigned int& numBytesParsed) const;

    //! \internal
    // internal data
private:
    struct BamAlignmentSupportData
    {

        //! \internal
        // data members
        std::string AllCharData;
        uint32_t BlockLength;
        uint32_t NumCigarOperations;
        uint32_t QueryNameLength;
        uint32_t QuerySequenceLength;
        bool HasCoreOnly;

        //! \internal
        // constructor
        BamAlignmentSupportData()
            : BlockLength(0)
            , NumCigarOperations(0)
            , QueryNameLength(0)
            , QuerySequenceLength(0)
            , HasCoreOnly(false)
        {}
    };
    BamAlignmentSupportData SupportData;
    friend class Internal::BamReaderPrivate;
    friend class Internal::BamWriterPrivate;

    mutable std::string ErrorString;  // mutable to allow updates even in logically const methods
}